

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccmake.cxx
# Opt level: O2

int main(int argc,char **argv)

{
  short sVar1;
  short sVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  char **argv_00;
  long lVar6;
  ostream *poVar7;
  cmCursesMainForm *this;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar8;
  ulong uVar9;
  ulong uVar10;
  string arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> generators;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b0;
  CommandLineArguments encoding_args;
  _Any_data local_480;
  code *local_470;
  code *local_468;
  cmDocumentation doc;
  string cacheDir;
  
  cmSystemTools::EnsureStdPipes();
  cmsys::Encoding::CommandLineArguments::Main(&encoding_args,argc,argv);
  uVar4 = cmsys::Encoding::CommandLineArguments::argc(&encoding_args);
  argv_00 = cmsys::Encoding::CommandLineArguments::argv(&encoding_args);
  cmSystemTools::InitializeLibUV();
  cmSystemTools::FindCMakeResources(*argv_00);
  cmDocumentation::cmDocumentation(&doc);
  cmDocumentation::addCMakeStandardDocSections(&doc);
  bVar3 = cmDocumentation::CheckOptions(&doc,uVar4,argv_00,(char *)0x0);
  if (bVar3) {
    cmake::cmake((cmake *)&cacheDir,RoleInternal,Unknown);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arg,"",(allocator<char> *)&generators);
    cmake::SetHomeDirectory((cmake *)&cacheDir,&arg);
    std::__cxx11::string::~string((string *)&arg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arg,"",(allocator<char> *)&generators);
    cmake::SetHomeOutputDirectory((cmake *)&cacheDir,&arg);
    std::__cxx11::string::~string((string *)&arg);
    cmake::AddCMakePaths((cmake *)&cacheDir);
    cmake::GetGeneratorsDocumentation(&generators,(cmake *)&cacheDir);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arg,"ccmake",(allocator<char> *)&args);
    cmDocumentation::SetName(&doc,&arg);
    std::__cxx11::string::~string((string *)&arg);
    cmDocumentation::SetSection(&doc,"Name",cmDocumentationName);
    cmDocumentation::SetSection(&doc,"Usage",cmDocumentationUsage);
    if (uVar4 == 1) {
      cmDocumentation::AppendSection(&doc,"Usage",cmDocumentationUsageNote);
    }
    cmDocumentation::AppendSection(&doc,"Generators",&generators);
    cmDocumentation::PrependSection(&doc,"Options",cmDocumentationOptions);
    bVar3 = cmDocumentation::PrintRequestedDocumentation(&doc,(ostream *)&std::cout);
    uVar4 = (uint)!bVar3;
    std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector(&generators);
    cmake::~cmake((cmake *)&cacheDir);
    goto LAB_0013f9e8;
  }
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar10 = 0;
  uVar8 = extraout_RDX;
  uVar9 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar9 = uVar10;
  }
  while (uVar9 != 0) {
    iVar5 = strcmp(*argv_00,"-debug");
    if (iVar5 == 0) {
      uVar10 = 1;
      uVar8 = extraout_RDX_00;
    }
    else {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,argv_00)
      ;
      uVar8 = extraout_RDX_01;
    }
    argv_00 = argv_00 + 1;
    uVar9 = uVar9 - 1;
  }
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            (&cacheDir,(SystemTools *)0x1,SUB81(uVar8,0));
  for (uVar9 = 1;
      uVar9 < (ulong)((long)args.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)args.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5);
      uVar9 = (ulong)((int)uVar9 + 1)) {
    std::__cxx11::string::string
              ((string *)&arg,
               (string *)
               (args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar9));
    lVar6 = std::__cxx11::string::find((char *)&arg,0x419bfc);
    if (lVar6 == 0) {
      std::__cxx11::string::substr((ulong)&generators,(ulong)&arg);
      std::__cxx11::string::operator=((string *)&cacheDir,(string *)&generators);
      std::__cxx11::string::~string((string *)&generators);
    }
    std::__cxx11::string::~string((string *)&arg);
  }
  cmSystemTools::s_DisableRunCommandOutput = true;
  if (uVar10 != 0) {
    cmCursesForm::DebugStart();
  }
  initscr();
  noecho();
  cbreak();
  uVar4 = 1;
  keypad(_stdscr,1);
  signal(0x1c,onsig);
  if (_stdscr == 0) {
LAB_0013f812:
    endwin();
    poVar7 = std::operator<<((ostream *)&std::cerr,"Window is too small. A size of at least ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x41);
    poVar7 = std::operator<<(poVar7," x ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,6);
    poVar7 = std::operator<<(poVar7," is required to run ccmake.");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  else {
    sVar1 = *(short *)(_stdscr + 4);
    sVar2 = *(short *)(_stdscr + 6);
    if (sVar1 < 5 || sVar2 < 0x40) goto LAB_0013f812;
    this = (cmCursesMainForm *)operator_new(0x110);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_4b0,&args);
    uVar4 = (int)sVar2 + 1;
    cmCursesMainForm::cmCursesMainForm(this,&local_4b0,uVar4);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_4b0);
    iVar5 = cmCursesMainForm::LoadCache(this,cacheDir._M_dataplus._M_p);
    if (iVar5 == 0) {
      local_480._8_8_ = 0;
      local_468 = std::
                  _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CursesDialog/ccmake.cxx:154:5)>
                  ::_M_invoke;
      local_470 = std::
                  _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CursesDialog/ccmake.cxx:154:5)>
                  ::_M_manager;
      local_480._M_unused._0_8_ = (undefined8)this;
      cmSystemTools::SetMessageCallback((MessageCallback *)&local_480);
      std::_Function_base::~_Function_base((_Function_base *)&local_480);
      cmCursesForm::CurrentForm = (cmCursesForm *)this;
      cmCursesMainForm::InitializeUI(this);
      iVar5 = cmCursesMainForm::Configure(this,1);
      if (iVar5 == 0) {
        (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])
                  (this,1,1,(ulong)uVar4,(ulong)((int)sVar1 + 1));
        (*(this->super_cmCursesForm)._vptr_cmCursesForm[2])(this);
      }
      curses_clear();
      if (_stdscr == 0) {
        uVar9 = 0xffffffffffffffff;
      }
      else {
        uVar9 = (ulong)((int)*(short *)(_stdscr + 4) + 1);
      }
      wtouchln(_stdscr,0,uVar9,1);
      endwin();
      if (cmCursesForm::CurrentForm != (cmCursesForm *)0x0) {
        (*cmCursesForm::CurrentForm->_vptr_cmCursesForm[1])();
      }
      cmCursesForm::CurrentForm = (cmCursesForm *)0x0;
      poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      uVar4 = 0;
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    else {
      curses_clear();
      if (_stdscr == 0) {
        uVar9 = 0xffffffffffffffff;
      }
      else {
        uVar9 = (ulong)((int)*(short *)(_stdscr + 4) + 1);
      }
      uVar4 = 1;
      wtouchln(_stdscr,0,uVar9,1);
      endwin();
      (*(this->super_cmCursesForm)._vptr_cmCursesForm[1])(this);
      std::operator<<((ostream *)&std::cerr,"Error running cmake::LoadCache().  Aborting.\n");
    }
  }
  std::__cxx11::string::~string((string *)&cacheDir);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
LAB_0013f9e8:
  cmDocumentation::~cmDocumentation(&doc);
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments(&encoding_args);
  return uVar4;
}

Assistant:

int main(int argc, char const* const* argv)
{
  cmSystemTools::EnsureStdPipes();
  cmsys::Encoding::CommandLineArguments encoding_args =
    cmsys::Encoding::CommandLineArguments::Main(argc, argv);
  argc = encoding_args.argc();
  argv = encoding_args.argv();

  cmSystemTools::InitializeLibUV();
  cmSystemTools::FindCMakeResources(argv[0]);
  cmDocumentation doc;
  doc.addCMakeStandardDocSections();
  if (doc.CheckOptions(argc, argv)) {
    cmake hcm(cmake::RoleInternal, cmState::Unknown);
    hcm.SetHomeDirectory("");
    hcm.SetHomeOutputDirectory("");
    hcm.AddCMakePaths();
    auto generators = hcm.GetGeneratorsDocumentation();
    doc.SetName("ccmake");
    doc.SetSection("Name", cmDocumentationName);
    doc.SetSection("Usage", cmDocumentationUsage);
    if (argc == 1) {
      doc.AppendSection("Usage", cmDocumentationUsageNote);
    }
    doc.AppendSection("Generators", generators);
    doc.PrependSection("Options", cmDocumentationOptions);
    return doc.PrintRequestedDocumentation(std::cout) ? 0 : 1;
  }

  bool debug = false;
  unsigned int i;
  int j;
  std::vector<std::string> args;
  for (j = 0; j < argc; ++j) {
    if (strcmp(argv[j], "-debug") == 0) {
      debug = true;
    } else {
      args.emplace_back(argv[j]);
    }
  }

  std::string cacheDir = cmSystemTools::GetCurrentWorkingDirectory();
  for (i = 1; i < args.size(); ++i) {
    std::string arg = args[i];
    if (arg.find("-B", 0) == 0) {
      cacheDir = arg.substr(2);
    }
  }

  cmSystemTools::DisableRunCommandOutput();

  if (debug) {
    cmCursesForm::DebugStart();
  }

  initscr();            /* Initialization */
  noecho();             /* Echo off */
  cbreak();             /* nl- or cr not needed */
  keypad(stdscr, true); /* Use key symbols as KEY_DOWN */

  signal(SIGWINCH, onsig);

  int x, y;
  getmaxyx(stdscr, y, x);
  if (x < cmCursesMainForm::MIN_WIDTH || y < cmCursesMainForm::MIN_HEIGHT) {
    endwin();
    std::cerr << "Window is too small. A size of at least "
              << cmCursesMainForm::MIN_WIDTH << " x "
              << cmCursesMainForm::MIN_HEIGHT << " is required to run ccmake."
              << std::endl;
    return 1;
  }

  cmCursesMainForm* myform;

  myform = new cmCursesMainForm(args, x);
  if (myform->LoadCache(cacheDir.c_str())) {
    curses_clear();
    touchwin(stdscr);
    endwin();
    delete myform;
    std::cerr << "Error running cmake::LoadCache().  Aborting.\n";
    return 1;
  }

  cmSystemTools::SetMessageCallback(
    [myform](const std::string& message, const char* title) {
      myform->AddError(message, title);
    });

  cmCursesForm::CurrentForm = myform;

  myform->InitializeUI();
  if (myform->Configure(1) == 0) {
    myform->Render(1, 1, x, y);
    myform->HandleInput();
  }

  // Need to clean-up better
  curses_clear();
  touchwin(stdscr);
  endwin();
  delete cmCursesForm::CurrentForm;
  cmCursesForm::CurrentForm = nullptr;

  std::cout << std::endl << std::endl;

  return 0;
}